

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_json_read_invalid(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uVar6;
  int *__haystack;
  bson_t bson;
  bson_error_t error;
  undefined1 auStack_6a0 [16];
  code *pcStack_690;
  int iStack_688;
  int iStack_684;
  char acStack_680 [504];
  code *pcStack_488;
  undefined1 auStack_480 [232];
  long lStack_398;
  undefined1 *puStack_390;
  code *pcStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  int local_2a0;
  int local_29c;
  
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  pcStack_388 = (code *)0x130bd8;
  lVar3 = bson_json_reader_new(0,test_bson_json_read_invalid_helper,0,0,0);
  pcStack_388 = (code *)0x130bee;
  iVar2 = bson_json_reader_read(lVar3,&local_380,&local_2a0);
  if (iVar2 == -1) {
    if (local_2a0 != 1) goto LAB_00130c25;
    if (local_29c == 1) {
      pcStack_388 = (code *)0x130c0f;
      bson_json_reader_destroy(lVar3);
      pcStack_388 = (code *)0x130c17;
      bson_destroy(&local_380);
      return;
    }
  }
  else {
    pcStack_388 = (code *)0x130c25;
    test_bson_json_read_invalid_cold_1();
LAB_00130c25:
    pcStack_388 = (code *)0x130c2a;
    test_bson_json_read_invalid_cold_2();
  }
  pcStack_388 = test_bson_json_read_raw_utf8;
  test_bson_json_read_invalid_cold_3();
  pcStack_488 = (code *)0x130c56;
  lStack_398 = lVar3;
  puStack_390 = (undefined1 *)&local_380;
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  lVar4 = bson_new_from_json(anon_var_dwarf_1a4c2,0xffffffffffffffff,0);
  if (lVar4 == 0) {
    pcStack_488 = (code *)0x130cf1;
    test_bson_json_read_raw_utf8_cold_5();
LAB_00130cf1:
    pcStack_488 = (code *)0x130cf6;
    test_bson_json_read_raw_utf8_cold_1();
    lVar4 = lVar3;
LAB_00130cf6:
    pcStack_488 = (code *)0x130cfb;
    test_bson_json_read_raw_utf8_cold_4();
LAB_00130cfb:
    pcStack_488 = (code *)0x130d03;
    test_bson_json_read_raw_utf8_cold_2();
  }
  else {
    pcStack_488 = (code *)0x130c77;
    cVar1 = bson_iter_init_find(auStack_480,lVar4,anon_var_dwarf_48e4 + 0xc);
    lVar3 = lVar4;
    if (cVar1 == '\0') goto LAB_00130cf1;
    pcStack_488 = (code *)0x130c83;
    pcVar5 = (char *)bson_iter_key(auStack_480);
    if (pcVar5 != anon_var_dwarf_48e4 + 0xc) {
      pcStack_488 = (code *)0x130c90;
      pcVar5 = (char *)bson_iter_key(auStack_480);
      pcStack_488 = (code *)0x130c9f;
      iVar2 = strcmp(pcVar5,anon_var_dwarf_48e4 + 0xc);
      if (iVar2 == 0) goto LAB_00130ca3;
      goto LAB_00130cfb;
    }
LAB_00130ca3:
    pcStack_488 = (code *)0x130cad;
    pcVar5 = (char *)bson_iter_utf8(auStack_480);
    if (pcVar5 == anon_var_dwarf_48e4 + 0xc) {
LAB_00130ccf:
      pcStack_488 = (code *)0x130cd7;
      cVar1 = bson_iter_next(auStack_480);
      if (cVar1 == '\0') {
        pcStack_488 = (code *)0x130ce3;
        bson_destroy(lVar4);
        return;
      }
      goto LAB_00130cf6;
    }
    pcStack_488 = (code *)0x130cbc;
    pcVar5 = (char *)bson_iter_utf8(auStack_480,0);
    pcStack_488 = (code *)0x130ccb;
    iVar2 = strcmp(pcVar5,anon_var_dwarf_48e4 + 0xc);
    if (iVar2 == 0) goto LAB_00130ccf;
  }
  pcStack_488 = test_bson_json_read_corrupt_utf8;
  test_bson_json_read_raw_utf8_cold_3();
  __haystack = &iStack_688;
  pcStack_690 = (code *)0x130d25;
  pcStack_488 = (code *)lVar4;
  memset(&iStack_688,0,0x200);
  pcStack_690 = (code *)0x130d3b;
  lVar3 = bson_new_from_json(anon_var_dwarf_1a50a,0xffffffffffffffff,&iStack_688);
  if (lVar3 == 0) {
    __haystack = &iStack_688;
    if (iStack_688 != 1) goto LAB_00130dbd;
    __haystack = &iStack_688;
    if (iStack_684 != 1) goto LAB_00130dc2;
    __haystack = (int *)acStack_680;
    pcStack_690 = (code *)0x130d65;
    pcVar5 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
    if (pcVar5 == (char *)0x0) goto LAB_00130dc7;
    pcStack_690 = (code *)0x130d80;
    lVar3 = bson_new_from_json(anon_var_dwarf_1a516,0xffffffffffffffff,&iStack_688);
    if (lVar3 != 0) goto LAB_00130db8;
    if (iStack_688 != 1) goto LAB_00130dcf;
    if (iStack_684 == 1) {
      pcStack_690 = (code *)0x130da5;
      pcVar5 = strstr((char *)__haystack,"invalid bytes in UTF8 string");
      if (pcVar5 != (char *)0x0) {
        return;
      }
      goto LAB_00130dd9;
    }
  }
  else {
    pcStack_690 = (code *)0x130db8;
    test_bson_json_read_corrupt_utf8_cold_1();
LAB_00130db8:
    pcStack_690 = (code *)0x130dbd;
    test_bson_json_read_corrupt_utf8_cold_4();
LAB_00130dbd:
    pcStack_690 = (code *)0x130dc2;
    test_bson_json_read_corrupt_utf8_cold_2();
LAB_00130dc2:
    pcStack_690 = (code *)0x130dc7;
    test_bson_json_read_corrupt_utf8_cold_3();
LAB_00130dc7:
    pcStack_690 = (code *)0x130dcf;
    test_bson_json_read_corrupt_utf8_cold_8();
LAB_00130dcf:
    pcStack_690 = (code *)0x130dd4;
    test_bson_json_read_corrupt_utf8_cold_5();
  }
  pcStack_690 = (code *)0x130dd9;
  test_bson_json_read_corrupt_utf8_cold_6();
LAB_00130dd9:
  pcStack_690 = test_bson_json_read_decimal128;
  test_bson_json_read_corrupt_utf8_cold_7();
  pcStack_690 = (code *)__haystack;
  bson_decimal128_from_string("123.5",auStack_6a0);
  uVar6 = bson_bcon_magic();
  iVar2 = 0x14ca78;
  uVar6 = bcon_new(0,"decimal",uVar6,0x12,auStack_6a0,0);
  _test_bson_json_read_compare("{ \"decimal\" : { \"$numberDecimal\" : \"123.5\" }}",iVar2,uVar6,0);
  return;
}

Assistant:

static void
test_bson_json_read_invalid (void)
{
   bson_error_t error;
   bson_json_reader_t *reader;
   int r;
   bson_t bson = BSON_INITIALIZER;

   reader = bson_json_reader_new (
      NULL, test_bson_json_read_invalid_helper, NULL, false, 0);

   r = bson_json_reader_read (reader, &bson, &error);

   BSON_ASSERT (r == -1);
   BSON_ASSERT (error.domain == BSON_ERROR_JSON);
   BSON_ASSERT (error.code == BSON_JSON_ERROR_READ_CORRUPT_JS);

   bson_json_reader_destroy (reader);
   bson_destroy (&bson);
}